

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

QSize __thiscall QWizard::sizeHint(QWizard *this)

{
  long lVar1;
  uint uVar2;
  QSize QVar3;
  QWizardPage *pQVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  QWidget local_48;
  
  local_48.data = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  QVar3 = QLayout::totalSizeHint(*(QLayout **)(lVar1 + 0x4c8));
  uVar6 = 0x168;
  uVar2 = 500;
  if ((*(int *)(lVar1 + 900) == 2) && (*(int *)(lVar1 + 0x340) != -1)) {
    lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
    local_48._28_4_ = *(undefined4 *)(lVar1 + 0x340);
    local_48.super_QObject = (QObject)0x0;
    local_48._1_7_ = 0;
    pQVar4 = QMap<int,_QWizardPage_*>::value
                       ((QMap<int,_QWizardPage_*> *)(lVar1 + 0x2e0),(int *)&local_48.field_0x1c,
                        (QWizardPage **)&local_48);
    QWizardPage::pixmap((QWizardPage *)&local_48,(WizardPixmap)pQVar4);
    uVar5 = QPixmap::size();
    QPixmap::~QPixmap((QPixmap *)&local_48);
    uVar8 = (uint)uVar5;
    uVar2 = 0x268;
    if (uVar5 >> 0x20 != 0 || uVar8 != 0) {
      uVar6 = (uint)(uVar5 >> 0x20);
      uVar2 = 0x268;
      if ((int)uVar6 <= (int)uVar8) {
        uVar2 = uVar8;
      }
    }
  }
  uVar5 = (ulong)uVar2;
  if ((int)uVar2 < QVar3.wd.m_i.m_i) {
    uVar5 = (ulong)QVar3 & 0xffffffff;
  }
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < QVar3.ht.m_i.m_i) {
    uVar7 = (ulong)QVar3 >> 0x20;
  }
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) != local_48.data) {
    __stack_chk_fail();
  }
  return (QSize)(uVar5 | uVar7 << 0x20);
}

Assistant:

QSize QWizard::sizeHint() const
{
    Q_D(const QWizard);
    QSize result = d->mainLayout->totalSizeHint();
    QSize extra(500, 360);
    if (d->wizStyle == MacStyle && d->current != -1) {
        QSize pixmap(currentPage()->pixmap(BackgroundPixmap).size());
        extra.setWidth(616);
        if (!pixmap.isNull()) {
            extra.setHeight(pixmap.height());

            /*
                The width isn't always reliable as a size hint, as
                some wizard backgrounds just cover the leftmost area.
                Use a rule of thumb to determine if the width is
                reliable or not.
            */
            if (pixmap.width() >= pixmap.height())
                extra.setWidth(pixmap.width());
        }
    }
    return result.expandedTo(extra);
}